

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void __thiscall HTTPReplySender::thread_main(HTTPReplySender *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  int in_R8D;
  http_reply_err err;
  int local_18 [2];
  char *local_10;
  
  sVar1 = send(this,(int)local_18,in_RDX,in_RCX,in_R8D);
  if ((int)sVar1 != 0) {
    local_18[0] = 0;
    local_10 = (char *)0x0;
  }
  post_done_event(this,local_18[0],local_10);
  return;
}

Assistant:

void thread_main()
    {
        /* send the reply */
        http_reply_err err;
        if (send(&err))
        {
            /* post the successful 'finished' event */
            post_done_event(0, 0);
        }
        else
        {
            /* post the error */
            post_done_event(err.sock_err, err.msg);
        }
    }